

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

void __thiscall doctest::detail::logTestCrashed(detail *this)

{
  Color *this_00;
  char msg [1024];
  String local_420;
  char local_418 [1032];
  
  builtin_strncpy(local_418,"TEST CASE FAILED! (threw exception)\n\n",0x26);
  Color::use((Color *)this,Red);
  this_00 = (Color *)0x10b4c1;
  printf("%s");
  Color::use(this_00,None);
  String::String(&local_420,local_418);
  free(local_420.m_str);
  return;
}

Assistant:

void logTestCrashed() {
        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), "TEST CASE FAILED! (threw exception)\n\n");

        DOCTEST_PRINTF_COLORED(msg, Color::Red);

        printToDebugConsole(String(msg));
    }